

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerType.cpp
# Opt level: O0

void __thiscall hdc::PointerType::PointerType(PointerType *this,Type *type)

{
  Type *type_local;
  PointerType *this_local;
  
  Type::Type(&this->super_Type);
  (this->super_Type).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_00220570;
  Token::Token(&this->token);
  this->subtype = type;
  (this->super_Type).super_ASTNode.kind = AST_POINTER_TYPE;
  ASTNode::setParentNode(&type->super_ASTNode,(ASTNode *)this);
  return;
}

Assistant:

PointerType::PointerType(Type* type) {
    this->subtype = type;
    this->kind = AST_POINTER_TYPE;
    type->setParentNode(this);
}